

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::__sort_heap<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (iterator __first,iterator __last,_Iter_less_iter *__comp)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  lVar3 = (long)__last.i - (long)__first.i;
  if (4 < lVar3) {
    piVar2 = __last.i + -1;
    do {
      iVar1 = *piVar2;
      *piVar2 = *__first.i;
      lVar3 = lVar3 + -4;
      __adjust_heap<QList<int>::iterator,long_long,int,__gnu_cxx::__ops::_Iter_less_iter>
                (__first.i,0,lVar3 >> 2,iVar1);
      piVar2 = piVar2 + -1;
    } while (4 < lVar3);
  }
  return;
}

Assistant:

inline qsizetype operator-(iterator j) const { return i - j.i; }